

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

PermuteLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::PermuteLayerParams>
          (Arena *arena)

{
  PermuteLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (PermuteLayerParams *)operator_new(0x28);
    CoreML::Specification::PermuteLayerParams::PermuteLayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (PermuteLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x28,(type_info *)&CoreML::Specification::PermuteLayerParams::typeinfo);
    CoreML::Specification::PermuteLayerParams::PermuteLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }